

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O3

void __thiscall
reader_authority_suite::test_ipv6_line_6a_v4::test_method(test_ipv6_line_6a_v4 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *local_150;
  view_type *local_148;
  undefined1 local_140 [8];
  undefined1 local_138 [16];
  char local_128 [4];
  view_type local_124;
  undefined8 *local_110;
  char *local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined8 *local_f0;
  char **local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  view_type **local_c8;
  char *local_c0;
  char *local_b8;
  basic_authority<char> local_b0;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char input [21];
  
  builtin_strncpy(input,"[1111::FFFF:1.2.3.4]",0x15);
  local_b0.super_base<char,_trial::url::reader::basic_authority>.input.len_ = strlen(input);
  local_b0.super_base<char,_trial::url::reader::basic_authority>.current_token = end;
  local_b0.super_base<char,_trial::url::reader::basic_authority>.input.ptr_ = input;
  local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_ = input;
  local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ =
       local_b0.super_base<char,_trial::url::reader::basic_authority>.input.len_;
  trial::url::reader::basic_authority<char>::do_next(&local_b0);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x121);
  local_124.len_._4_1_ = 0;
  local_124._4_8_ = &PTR__lazy_ostream_00186288;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_148 = &local_124;
  local_124.ptr_._0_4_ =
       local_b0.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_150 = local_128;
  local_128[0] = '\x06';
  local_128[1] = '\0';
  local_128[2] = '\0';
  local_128[3] = '\0';
  local_140[0] = local_b0.super_base<char,_trial::url::reader::basic_authority>.current_token ==
                 authority_host_ipv6;
  local_138 = (undefined1  [16])0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_c8 = &local_148;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00186618;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_150;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00186618;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_138 + 8));
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0x122);
  local_124.len_._4_1_ = 0;
  local_124._4_8_ = &PTR__lazy_ostream_00186288;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  if (local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ == 0x12) {
    auVar1[0] = -(*local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                 == '1');
    auVar1[1] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [1] == '1');
    auVar1[2] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [2] == '1');
    auVar1[3] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [3] == '1');
    auVar1[4] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [4] == ':');
    auVar1[5] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [5] == ':');
    auVar1[6] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [6] == 'F');
    auVar1[7] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [7] == 'F');
    auVar1[8] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [8] == 'F');
    auVar1[9] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                  [9] == 'F');
    auVar1[10] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                   [10] == ':');
    auVar1[0xb] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xb] == '1');
    auVar1[0xc] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xc] == '.');
    auVar1[0xd] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xd] == '2');
    auVar1[0xe] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xe] == '.');
    auVar1[0xf] = -(local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_
                    [0xf] == '3');
    auVar2[0] = -((char)*(undefined2 *)
                         (local_b0.super_base<char,_trial::url::reader::basic_authority>.
                          current_view.ptr_ + 0x10) == '.');
    auVar2[1] = -((char)((ushort)*(undefined2 *)
                                  (local_b0.super_base<char,_trial::url::reader::basic_authority>.
                                   current_view.ptr_ + 0x10) >> 8) == '4');
    auVar2[2] = 0xff;
    auVar2[3] = 0xff;
    auVar2[4] = 0xff;
    auVar2[5] = 0xff;
    auVar2[6] = 0xff;
    auVar2[7] = 0xff;
    auVar2[8] = 0xff;
    auVar2[9] = 0xff;
    auVar2[10] = 0xff;
    auVar2[0xb] = 0xff;
    auVar2[0xc] = 0xff;
    auVar2[0xd] = 0xff;
    auVar2[0xe] = 0xff;
    auVar2[0xf] = 0xff;
    auVar2 = auVar2 & auVar1;
    local_140[0] = (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    local_140[0] = false;
  }
  local_138 = (undefined1  [16])0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00186598;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_148;
  local_150 = "1111::FFFF:1.2.3.4";
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_00186b18;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_150;
  local_148 = &local_b0.super_base<char,_trial::url::reader::basic_authority>.current_view;
  boost::test_tools::tt_detail::report_assertion
            (local_140,(undefined1 *)((long)&local_124.ptr_ + 4),&local_c0,0x122,2,2,2,
             "reader.literal()",&local_e0,"\"1111::FFFF:1.2.3.4\"",&local_100);
  boost::detail::shared_count::~shared_count((shared_count *)(local_138 + 8));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_6a_v4)
{
    const char input[] = "[1111::FFFF:1.2.3.4]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111::FFFF:1.2.3.4");
}